

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdata.c
# Opt level: O2

_Bool duckdb_je_hpdata_purge_next
                (hpdata_t *hpdata,hpdata_purge_state_t *purge_state,void **r_purge_addr,
                size_t *r_purge_size)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  fb_group_t fVar7;
  ulong uVar8;
  size_t sVar9;
  
  uVar4 = purge_state->next_purge_search_begin;
  if (uVar4 != 0x200) {
    uVar5 = uVar4 >> 6;
    uVar3 = uVar4 & 0xffffffffffffffc0;
    fVar7 = (purge_state->to_purge[uVar5] >> ((byte)uVar4 & 0x3f)) << ((byte)uVar4 & 0x3f);
    while (fVar7 == 0) {
      if (uVar5 == 7) {
        return false;
      }
      lVar1 = uVar5 + 1;
      uVar5 = uVar5 + 1;
      uVar3 = uVar3 + 0x40;
      fVar7 = purge_state->to_purge[lVar1];
    }
    lVar1 = 0;
    if (fVar7 != 0) {
      for (; (fVar7 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
      }
    }
    if (lVar1 + uVar3 != 0x200) {
      uVar8 = uVar5 & 0x3ffffffffffffff;
      uVar4 = (~purge_state->to_purge[uVar8] >> ((byte)lVar1 & 0x3f)) << ((byte)lVar1 & 0x3f);
      lVar6 = uVar5 * -0x40;
      do {
        if (uVar4 != 0) {
          lVar2 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> lVar2 & 1) == 0; lVar2 = lVar2 + 1) {
            }
          }
          sVar9 = lVar2 - lVar6;
          if (0x1ff < sVar9) {
            sVar9 = 0x200;
          }
LAB_01e9172e:
          *r_purge_addr = (void *)((lVar1 + uVar3) * 0x1000 + (long)hpdata->h_address);
          *r_purge_size = ((sVar9 - lVar1) - uVar3) * 0x1000;
          purge_state->next_purge_search_begin = sVar9;
          purge_state->npurged = ((sVar9 + purge_state->npurged) - lVar1) - uVar3;
          return true;
        }
        if (uVar8 == 7) {
          sVar9 = 0x200;
          goto LAB_01e9172e;
        }
        uVar4 = ~purge_state->to_purge[uVar8 + 1];
        lVar6 = lVar6 + -0x40;
        uVar8 = uVar8 + 1;
      } while( true );
    }
  }
  return false;
}

Assistant:

bool
hpdata_purge_next(hpdata_t *hpdata, hpdata_purge_state_t *purge_state,
    void **r_purge_addr, size_t *r_purge_size) {
	/*
	 * Note that we don't have a consistency check here; we're accessing
	 * hpdata without synchronization, and therefore have no right to expect
	 * a consistent state.
	 */
	assert(!hpdata_alloc_allowed_get(hpdata));

	if (purge_state->next_purge_search_begin == HUGEPAGE_PAGES) {
		return false;
	}
	size_t purge_begin;
	size_t purge_len;
	bool found_range = fb_srange_iter(purge_state->to_purge, HUGEPAGE_PAGES,
	    purge_state->next_purge_search_begin, &purge_begin, &purge_len);
	if (!found_range) {
		return false;
	}

	*r_purge_addr = (void *)(
	    (byte_t *)hpdata_addr_get(hpdata) + purge_begin * PAGE);
	*r_purge_size = purge_len * PAGE;

	purge_state->next_purge_search_begin = purge_begin + purge_len;
	purge_state->npurged += purge_len;
	assert(purge_state->npurged <= HUGEPAGE_PAGES);

	return true;
}